

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall helics::apps::Tracer::buildArgParserApp(Tracer *this)

{
  Option *pOVar1;
  App *pAVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  allocator<char> local_241;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[40]>((char (*) [40])this);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"--allow_iteration",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"allow iteration on values",&local_241);
  pOVar1 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar2,&local_40,(bool *)(in_RSI + 0xa1),&local_60);
  CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"--print",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"print messages to the screen",&local_241);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar2,&local_80,(bool *)(in_RSI + 0xa0),&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"--skiplog",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"print messages to the screen through cout",&local_241);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar2,&local_c0,(bool *)(in_RSI + 0xa2),&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"cloning",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,
             "Options related to endpoint cloning operations and specifications",&local_241);
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_100,&local_120)->super_App;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"--clone",&local_241);
  pOVar1 = CLI::App::add_option<const_char[52],_(CLI::detail::enabler)0>
                     (pAVar2,&local_140,
                      (char (*) [52])"existing endpoints to clone all packets to and from");
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:465:16)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:465:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_240);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"--sourceclone",&local_241);
  pOVar1 = CLI::App::add_option<const_char[99],_(CLI::detail::enabler)0>
                     (pAVar2,&local_160,
                      (char (*) [99])
                      "existing endpoints to capture generated packets from, this argument may be specified multiple time"
                     );
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:476:16)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:476:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_240);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1 = CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"--destclone",&local_241);
  pOVar1 = CLI::App::add_option<const_char[133],_(CLI::detail::enabler)0>
                     (pAVar2,&local_180,
                      (char (*) [133])
                      "existing endpoints to capture all packets with the specified endpoint as a destination, this argument may be specified multiple time"
                     );
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:485:16)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:485:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_240);
  (pOVar1->super_OptionBase<CLI::Option>).delimiter_ = ',';
  pOVar1 = CLI::Option::ignore_underscore<CLI::App>(pOVar1,true);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  std::__cxx11::string::~string((string *)&local_180);
  pAVar2 = (App *)(this->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"capture_group",(allocator<char> *)&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "Options related to capturing publications, endpoints, or federates",&local_241);
  pAVar2 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_1a0,&local_1c0)->super_App;
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"--tag,--publication,--pub",&local_241);
  pOVar1 = CLI::App::add_option<const_char[81],_(CLI::detail::enabler)0>
                     (pAVar2,&local_1e0,
                      (char (*) [81])
                      "tags(publications) to record, this argument may be specified any number of times"
                     );
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:497:16)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:497:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_240);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"--endpoints",&local_241);
  pOVar1 = CLI::App::add_option<const_char[67],_(CLI::detail::enabler)0>
                     (pAVar2,&local_200,
                      (char (*) [67])
                      "endpoints to capture, this argument may be specified multiple time");
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:508:16)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:508:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_240);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"--capture",&local_241);
  pOVar1 = CLI::App::add_option<const_char[139],_(CLI::detail::enabler)0>
                     (pAVar2,&local_220,
                      (char (*) [139])
                      "capture all the publications of a particular federate capture=\"fed1;fed2\"  supports multiple arguments or a semicolon/comma separated list"
                     );
  local_240.super__Function_base._M_functor._8_8_ = 0;
  local_240._M_invoker =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:520:16)>
       ::_M_invoke;
  local_240.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Tracer.cpp:520:16)>
       ::_M_manager;
  pOVar1 = CLI::Option::each(pOVar1,&local_240);
  pOVar1->type_size_max_ = 1;
  pOVar1->type_size_min_ = 1;
  pOVar1->expected_max_ = 0x20000000;
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> Tracer::buildArgParserApp()
{
    using gmlc::utilities::stringOps::removeQuotes;
    using gmlc::utilities::stringOps::splitlineQuotes;

    auto app = std::make_shared<helicsCLI11App>("Command line options for the Tracer App");
    app->add_flag("--allow_iteration", allow_iteration, "allow iteration on values")
        ->ignore_underscore();
    app->add_flag("--print", printMessage, "print messages to the screen");
    app->add_flag("--skiplog", skiplog, "print messages to the screen through cout");
    auto* clone_group =
        app->add_option_group("cloning",
                              "Options related to endpoint cloning operations and specifications");
    clone_group->add_option("--clone", "existing endpoints to clone all packets to and from")
        ->each([this](const std::string& clone) {
            addDestEndpointClone(clone);
            addSourceEndpointClone(clone);
        })
        ->delimiter(',')
        ->type_size(-1);

    clone_group
        ->add_option(
            "--sourceclone",
            "existing endpoints to capture generated packets from, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    clone_group
        ->add_option("--destclone",
                     "existing endpoints to capture all packets with the specified endpoint as a "
                     "destination, this argument may be specified multiple time")
        ->each([this](const std::string& clone) { addSourceEndpointClone(clone); })
        ->delimiter(',')
        ->ignore_underscore()
        ->type_size(-1);

    auto* capture_group =
        app->add_option_group("capture_group",
                              "Options related to capturing publications, endpoints, or federates");
    capture_group
        ->add_option(
            "--tag,--publication,--pub",
            "tags(publications) to record, this argument may be specified any number of times")
        ->each([this](const std::string& tag) {
            auto taglist = splitlineQuotes(tag);
            for (const auto& tagname : taglist) {
                subkeys.emplace(removeQuotes(tagname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--endpoints",
                     "endpoints to capture, this argument may be specified multiple time")
        ->each([this](const std::string& ept) {
            auto eptlist = splitlineQuotes(ept);
            for (const auto& eptname : eptlist) {
                eptNames.emplace(removeQuotes(eptname), -1);
            }
        })
        ->type_size(-1);

    capture_group
        ->add_option("--capture",
                     "capture all the publications of a particular federate capture=\"fed1;fed2\"  "
                     "supports multiple arguments or a semicolon/comma separated list")
        ->each([this](const std::string& capt) {
            auto captFeds = splitlineQuotes(capt);
            for (auto& captFed : captFeds) {
                auto actCapt = removeQuotes(captFed);
                captureInterfaces.push_back(actCapt);
            }
        })
        ->type_size(-1);

    return app;
}